

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::write_content_with_provider
          (Server *this,Stream *strm,Request *req,Response *res,string *boundary,
          string *content_type)

{
  pointer ppVar1;
  pointer ppVar2;
  anon_class_16_2_633325cf content;
  bool bVar3;
  ulong uVar4;
  size_t length;
  ssize_t sVar5;
  ulong offset;
  ulong uVar6;
  _Any_data local_88;
  code *local_78;
  _Any_data local_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  
  length = res->content_length;
  if (length == 0) {
    std::function<void_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::function
              ((function<void_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)&local_88,
               &res->content_provider);
    sVar5 = detail::
            write_content_chunked<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>
                      (strm,(ContentProvider *)&local_88,(anon_class_8_1_8991fb9c)this);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
  }
  else {
    ppVar1 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar1 == ppVar2) {
      std::function<void_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::function
                ((function<void_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)&local_48,
                 &res->content_provider);
      sVar5 = detail::write_content(strm,(ContentProvider *)&local_48,0,res->content_length);
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
    }
    else {
      if ((long)ppVar2 - (long)ppVar1 != 0x10) {
        content.res = (Response *)strm;
        content.strm = (Stream *)res;
        bVar3 = detail::
                process_multipart_ranges_data<httplib::detail::write_multipart_ranges_data(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::write_multipart_ranges_data(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(char_const*)_1_,httplib::detail::write_multipart_ranges_data(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(unsigned_long,unsigned_long)_1_>
                          ((detail *)req,(Request *)res,(Response *)boundary,content_type,
                           (string *)strm,(anon_class_8_1_8991b55a)strm,
                           (anon_class_8_1_8991b55a)strm,content);
        if (bVar3) {
          return true;
        }
        return false;
      }
      offset = ppVar1->first;
      uVar4 = ppVar1->second;
      if ((offset & uVar4) == 0xffffffffffffffff) {
        offset = 0;
      }
      else {
        uVar6 = length - uVar4;
        if (offset == 0xffffffffffffffff) {
          uVar4 = length - 1;
          offset = uVar6;
        }
        if (uVar4 == 0xffffffffffffffff) {
          uVar4 = length - 1;
        }
        length = (uVar4 - offset) + 1;
      }
      std::function<void_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::function
                ((function<void_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)&local_68,
                 &res->content_provider);
      sVar5 = detail::write_content(strm,(ContentProvider *)&local_68,offset,length);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
    }
  }
  if (-1 < sVar5) {
    return true;
  }
  return false;
}

Assistant:

inline bool
Server::write_content_with_provider(Stream &strm, const Request &req,
                                    Response &res, const std::string &boundary,
                                    const std::string &content_type) {
  if (res.content_length) {
    if (req.ranges.empty()) {
      if (detail::write_content(strm, res.content_provider, 0,
                                res.content_length) < 0) {
        return false;
      }
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.content_length, 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      if (detail::write_content(strm, res.content_provider, offset, length) <
          0) {
        return false;
      }
    } else {
      if (!detail::write_multipart_ranges_data(strm, req, res, boundary,
                                               content_type)) {
        return false;
      }
    }
  } else {
    auto is_shutting_down = [this]() {
      return this->svr_sock_ == INVALID_SOCKET;
    };
    if (detail::write_content_chunked(strm, res.content_provider,
                                      is_shutting_down) < 0) {
      return false;
    }
  }
  return true;
}